

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_trap(void)

{
  int local_c;
  wchar_t i;
  
  for (local_c = 0; local_c < (int)(uint)z_info->trap_max; local_c = local_c + 1) {
    string_free(trap_info[local_c].name);
    mem_free(trap_info[local_c].text);
    string_free(trap_info[local_c].desc);
    string_free(trap_info[local_c].msg);
    string_free(trap_info[local_c].msg_good);
    string_free(trap_info[local_c].msg_bad);
    string_free(trap_info[local_c].msg_xtra);
    free_effect(trap_info[local_c].effect);
    free_effect(trap_info[local_c].effect_xtra);
  }
  mem_free(trap_info);
  return;
}

Assistant:

static void cleanup_trap(void)
{
	int i;
	for (i = 0; i < z_info->trap_max; i++) {
		string_free(trap_info[i].name);
		mem_free(trap_info[i].text);
		string_free(trap_info[i].desc);
		string_free(trap_info[i].msg);
		string_free(trap_info[i].msg_good);
		string_free(trap_info[i].msg_bad);
		string_free(trap_info[i].msg_xtra);
		free_effect(trap_info[i].effect);
		free_effect(trap_info[i].effect_xtra);
	}
	mem_free(trap_info);
}